

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsDeleteIndexedProperty(JsValueRef object,JsValueRef index)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  JsrtContext *pJVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  ScriptContext *__localScriptContext;
  JsErrorCode exitStatus;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  TTDRecorder _actionEntryPopper;
  AutoNestedHandledExceptionType local_2c [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  pJVar5 = JsrtContext::GetCurrent();
  if (pJVar5 == (JsrtContext *)0x0) {
    exitStatus = JsErrorNoCurrentContext;
    goto LAB_0036d360;
  }
  scriptContext = (((pJVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_2c,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_a8 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
             (ScriptEntryExitRecord *)auStack_a8,unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x99d,"(false)","Need to implement support here!!!");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  exitStatus = JsErrorInvalidArgument;
  if (object != (JsValueRef)0x0) {
    BVar4 = Js::JavascriptOperators::IsObject(object);
    if (BVar4 == 0) {
      exitStatus = JsErrorArgumentNotObject;
    }
    else {
      pRVar7 = Js::VarTo<Js::RecyclableObject>(object);
      pSVar1 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        exitStatus = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_0036d34e;
        object = Js::CrossSite::MarshalVar(scriptContext,pRVar7,false);
      }
      exitStatus = JsErrorInvalidArgument;
      if (index != (JsValueRef)0x0) {
        if ((ulong)index >> 0x30 == 0) {
          pRVar7 = Js::VarTo<Js::RecyclableObject>(index);
          pSVar1 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                   scriptContext.ptr;
          if (pSVar1 != scriptContext) {
            exitStatus = JsErrorWrongRuntime;
            if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_0036d34e;
            index = Js::CrossSite::MarshalVar(scriptContext,pRVar7,false);
          }
        }
        exitStatus = JsNoError;
        Js::JavascriptOperators::OP_DeleteElementI
                  (object,index,scriptContext,PropertyOperation_None);
      }
    }
  }
LAB_0036d34e:
  Js::EnterScriptObject::~EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_2c);
LAB_0036d360:
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsDeleteIndexedProperty(_In_ JsValueRef object, _In_ JsValueRef index)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_REFERENCE(index, scriptContext);

        Js::JavascriptOperators::OP_DeleteElementI((Js::Var)object, (Js::Var)index, scriptContext);

        return JsNoError;
    });
}